

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

Aig_Man_t * Gia_ManToAigSkip(Gia_Man_t *p,int nOutDelta)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t **ppNodes;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  
  if ((p->pNexts != (int *)0x0) || (p->pReprs != (Gia_Rpr_t *)0x0)) {
    __assert_fail("p->pNexts == NULL && p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x14a,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
  }
  if ((nOutDelta < 1) || (iVar2 = p->vCos->nSize, iVar2 % nOutDelta != 0)) {
    __assert_fail("nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x14b,"Aig_Man_t *Gia_ManToAigSkip(Gia_Man_t *, int)");
  }
  p_00 = Aig_ManStart(~(iVar2 + p->vCis->nSize) + p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar3);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar3);
  }
  p_00->pName = pcVar6;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar3);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar3);
  }
  p_00->pSpec = pcVar6;
  p_00->nConstrs = p->nConstrs;
  ppNodes = (Aig_Obj_t **)calloc((long)p->nObjs,8);
  *ppNodes = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      iVar2 = pVVar8->pArray[lVar9];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_006435d6;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      pAVar7 = Aig_ObjCreateCi(p_00);
      pGVar4 = p->pObjs;
      if ((pGVar1 < pGVar4) || (pGVar4 + p->nObjs <= pGVar1)) goto LAB_006435f5;
      ppNodes[(int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555] = pAVar7;
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
    } while (lVar9 < pVVar8->nSize);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    uVar10 = 0;
    do {
      iVar2 = pVVar8->pArray[uVar10];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_006435d6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      Gia_ManToAig_rec(p_00,ppNodes,p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff));
      if ((int)((uVar10 & 0xffffffff) % (ulong)(uint)nOutDelta) == 0) {
        pGVar4 = p->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + p->nObjs <= pGVar1)) {
LAB_006435f5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pAVar7 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                      ((ulong)(*(uint *)pGVar1 >> 0x1d & 1) ^
                                      (ulong)ppNodes[(int)((int)((ulong)((long)pGVar1 - (long)pGVar4
                                                                        ) >> 2) * -0x55555555 -
                                                          (*(uint *)pGVar1 & 0x1fffffff))]));
        pGVar4 = p->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + p->nObjs <= pGVar1)) goto LAB_006435f5;
        ppNodes[(int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555] = pAVar7;
      }
      uVar10 = uVar10 + 1;
      pVVar8 = p->vCos;
    } while ((long)uVar10 < (long)pVVar8->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  free(ppNodes);
  return p_00;
}

Assistant:

Aig_Man_t * Gia_ManToAigSkip( Gia_Man_t * p, int nOutDelta )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pNexts == NULL && p->pReprs == NULL );
    assert( nOutDelta > 0 && Gia_ManCoNum(p) % nOutDelta == 0 );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManAndNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
//    pNew->pSpec = Abc_UtilStrsav( p->pName );
    // create the PIs
    ppNodes = ABC_CALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    ppNodes[0] = Aig_ManConst0(pNew);
    Gia_ManForEachCi( p, pObj, i )
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCi( pNew );
    // add logic for the POs
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManToAig_rec( pNew, ppNodes, p, Gia_ObjFanin0(pObj) );        
        if ( i % nOutDelta != 0 )
            continue;
        ppNodes[Gia_ObjId(p, pObj)] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}